

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STVar.cpp
# Opt level: O3

void __thiscall jbcoin::detail::STVar::STVar(STVar *this,STVar *other)

{
  STVar *pSVar1;
  STBase *pSVar2;
  
  this->p_ = (STBase *)0x0;
  pSVar1 = (STVar *)other->p_;
  if (pSVar1 == other) {
    pSVar2 = (STBase *)(**(code **)(*(long *)&pSVar1->d_ + 0x18))(pSVar1,0x48,this);
    this->p_ = pSVar2;
  }
  else {
    this->p_ = (STBase *)pSVar1;
    other->p_ = (STBase *)0x0;
  }
  return;
}

Assistant:

STVar::STVar (STVar&& other)
{
    if (other.on_heap())
    {
        p_ = other.p_;
        other.p_ = nullptr;
    }
    else
    {
        p_ = other.p_->move(max_size, &d_);
    }
}